

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

PatternSyntax * __thiscall slang::parsing::Parser::parsePattern(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  PatternSyntax *pPVar4;
  ParenthesizedPatternSyntax *pPVar5;
  WildcardPatternSyntax *pWVar6;
  VariablePatternSyntax *pVVar7;
  SourceLocation SVar8;
  ExpressionSyntax *expr;
  ExpressionPatternSyntax *pEVar9;
  TaggedPatternSyntax *pTVar10;
  OrderedStructurePatternMemberSyntax *pOVar11;
  StructurePatternMemberSyntax *pSVar12;
  undefined4 extraout_var;
  StructurePatternSyntax *pSVar13;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *src;
  Token openBrace;
  Token TVar14;
  Token TVar15;
  Token TVar16;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token local_108;
  Token local_f8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e8;
  uint local_d8;
  undefined8 local_c8;
  Info *local_b8;
  undefined8 local_b0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  TVar14 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar14.kind;
  if (Comma < TVar2) {
    if (TVar2 == DotStar) {
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      pWVar6 = slang::syntax::SyntaxFactory::wildcardPattern(&this->factory,TVar14);
      return &pWVar6->super_PatternSyntax;
    }
    if (TVar2 == Dot) {
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      TVar15 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pVVar7 = slang::syntax::SyntaxFactory::variablePattern(&this->factory,TVar14,TVar15);
      return &pVVar7->super_PatternSyntax;
    }
    if (TVar2 == TaggedKeyword) {
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      TVar15 = ParserBase::expect(&this->super_ParserBase,Identifier);
      TVar16 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isPossiblePattern(TVar16.kind);
      if (bVar1) {
        pPVar4 = parsePattern(this);
      }
      else {
        pPVar4 = (PatternSyntax *)0x0;
      }
      pTVar10 = slang::syntax::SyntaxFactory::taggedPattern(&this->factory,TVar14,TVar15,pPVar4);
      return &pTVar10->super_PatternSyntax;
    }
LAB_00337f9e:
    expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x1,0);
    pEVar9 = slang::syntax::SyntaxFactory::expressionPattern(&this->factory,expr);
    return &pEVar9->super_PatternSyntax;
  }
  if (TVar2 != ApostropheOpenBrace) {
    if (TVar2 == OpenParenthesis) {
      TVar14 = ParserBase::consume(&this->super_ParserBase);
      pPVar4 = parsePattern(this);
      TVar15 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pPVar5 = slang::syntax::SyntaxFactory::parenthesizedPattern
                         (&this->factory,TVar14,pPVar4,TVar15);
      return &pPVar5->super_PatternSyntax;
    }
    goto LAB_00337f9e;
  }
  TVar14 = ParserBase::consume(&this->super_ParserBase);
  local_b8 = TVar14.info;
  local_b0 = TVar14._0_8_;
  Token::Token(&local_108);
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  if ((bVar1) && (TVar14 = ParserBase::peek(&this->super_ParserBase,1), TVar14.kind == Colon)) {
    TVar14 = ParserBase::peek(&this->super_ParserBase);
    local_f8 = TVar14;
    bVar1 = slang::syntax::SyntaxFacts::isCloseBrace(TVar14.kind);
    if (bVar1) {
      SVar8 = Token::location(&local_f8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x3d0005,SVar8);
      local_108 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(TVar14.kind);
      if (!bVar1) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar14,CloseBrace,&local_108,(DiagCode)0x3d0005);
        src = extraout_RDX_00;
        goto LAB_0033834b;
      }
      do {
        TVar14 = ParserBase::peek(&this->super_ParserBase);
        local_f8 = TVar14;
        pSVar12 = parseMemberPattern(this);
        local_e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar12;
        local_d8 = CONCAT31(local_d8._1_3_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e8._M_first);
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isCloseBrace(TVar15.kind);
        if (bVar1) break;
        bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
        if (!bVar1) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                              (&this->super_ParserBase,(DiagCode)0x3d0005,false);
            if (!bVar1) {
              local_108 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_00338342;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_e8._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_d8 = local_d8 & 0xffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e8._M_first);
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isCloseBrace(TVar15.kind);
        if (bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar15 = ParserBase::peek(&this->super_ParserBase);
      } while ((TVar14.info != TVar15.info || TVar14.kind != TVar15.kind) ||
              (bVar1 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                                 (&this->super_ParserBase,(DiagCode)0x3d0005,true), bVar1));
      local_108 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
  }
  else {
    TVar14 = ParserBase::peek(&this->super_ParserBase);
    local_f8 = TVar14;
    bVar1 = slang::syntax::SyntaxFacts::isCloseBrace(TVar14.kind);
    if (bVar1) {
      SVar8 = Token::location(&local_f8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x3d0005,SVar8);
      local_108 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossiblePatternOrComma(TVar14.kind);
      if (!bVar1) {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar14,CloseBrace,&local_108,(DiagCode)0x3d0005);
        src = extraout_RDX;
        goto LAB_0033834b;
      }
      do {
        TVar14 = ParserBase::peek(&this->super_ParserBase);
        local_f8 = TVar14;
        pPVar4 = parsePattern(this);
        pOVar11 = slang::syntax::SyntaxFactory::orderedStructurePatternMember(&this->factory,pPVar4)
        ;
        local_e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pOVar11;
        local_d8 = CONCAT31(local_d8._1_3_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e8._M_first);
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isCloseBrace(TVar15.kind);
        if (bVar1) break;
        bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
        if (!bVar1) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                              (&this->super_ParserBase,(DiagCode)0x3d0005,false);
            if (!bVar1) {
              local_108 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_00338342;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_e8._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_d8 = local_d8 & 0xffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e8._M_first);
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isCloseBrace(TVar15.kind);
        if (bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar15 = ParserBase::peek(&this->super_ParserBase);
      } while ((TVar14.info != TVar15.info || TVar14.kind != TVar15.kind) ||
              (bVar1 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace>
                                 (&this->super_ParserBase,(DiagCode)0x3d0005,true), bVar1));
      local_108 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    }
  }
LAB_00338342:
  src = local_108.info;
LAB_0033834b:
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_c8 = CONCAT44(extraout_var,iVar3);
  local_d8 = 3;
  local_e8 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
             ZEXT816(0x50bdd0);
  openBrace.info = local_b8;
  openBrace.kind = (undefined2)local_b0;
  openBrace._2_1_ = local_b0._2_1_;
  openBrace.numFlags.raw = local_b0._3_1_;
  openBrace.rawLen = local_b0._4_4_;
  pSVar13 = slang::syntax::SyntaxFactory::structurePattern
                      (&this->factory,openBrace,
                       (SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                       &local_e8._M_first,local_108);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    free(local_a8[0].data_);
  }
  return &pSVar13->super_PatternSyntax;
}

Assistant:

PatternSyntax& Parser::parsePattern() {
    switch (peek().kind) {
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& pattern = parsePattern();
            return factory.parenthesizedPattern(openParen, pattern,
                                                expect(TokenKind::CloseParenthesis));
        }
        case TokenKind::DotStar:
            return factory.wildcardPattern(consume());
        case TokenKind::Dot: {
            auto dot = consume();
            return factory.variablePattern(dot, expect(TokenKind::Identifier));
        }
        case TokenKind::TaggedKeyword: {
            auto tagged = consume();
            auto name = expect(TokenKind::Identifier);

            PatternSyntax* pattern = nullptr;
            if (isPossiblePattern(peek().kind))
                pattern = &parsePattern();

            return factory.taggedPattern(tagged, name, pattern);
        }
        case TokenKind::ApostropheOpenBrace: {
            auto openBrace = consume();
            Token closeBrace;
            SmallVector<TokenOrSyntax, 4> buffer;

            if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Colon) {
                parseList<isIdentifierOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() { return &parseMemberPattern(); });
            }
            else {
                parseList<isPossiblePatternOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() {
                        auto& pattern = parsePattern();
                        return &factory.orderedStructurePatternMember(pattern);
                    });
            }

            return factory.structurePattern(openBrace, buffer.copy(alloc), closeBrace);
        }
        default:
            break;
    }

    // otherwise, it's either an expression or an error (parseExpression will handle that for us)
    return factory.expressionPattern(parseSubExpression(ExpressionOptions::PatternContext, 0));
}